

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerCylinderKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  XrCompositionLayerCylinderKHR *pXVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrEyeVisibility XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  XrEyeVisibility __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  char cVar18;
  XrGeneratedDispatchTable *pXVar19;
  string next_prefix;
  string type_prefix;
  string eyevisibility_prefix;
  string space_prefix;
  string layerflags_prefix;
  string pose_prefix;
  string subimage_prefix;
  string aspectratio_prefix;
  string centralangle_prefix;
  string radius_prefix;
  ostringstream oss_space;
  ostringstream oss_radius;
  ostringstream oss_aspectRatio;
  ostringstream oss_centralAngle;
  long *local_818;
  long local_810;
  long local_808 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  long *local_778;
  long local_770;
  long local_768 [2];
  long *local_758;
  long local_750;
  long local_748 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  undefined1 local_6d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  string local_6b8;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  string local_678;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  PFN_xrEnumerateViewConfigurations local_5f8;
  PFN_xrGetViewConfigurationProperties p_Stack_5f0;
  PFN_xrEnumerateViewConfigurationViews local_5e8;
  PFN_xrEnumerateSwapchainFormats p_Stack_5e0;
  ios_base local_5a8 [272];
  undefined1 local_498 [112];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  local_498._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_618,'\x12');
  *local_618._M_dataplus._M_p = '0';
  local_618._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_618._M_dataplus._M_p + local_618._M_string_length + -1;
  lVar14 = 0;
  do {
    bVar2 = local_498[lVar14];
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar14 = lVar14 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar14 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7f8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_7f8);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar17 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar16 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar17 = uVar7;
        uVar13 = (uint)uVar16;
        if (uVar13 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00135035;
        }
        if (uVar13 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00135035;
        }
        if (uVar13 < 10000) goto LAB_00135035;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar17 + 4;
      } while (99999 < uVar13);
      uVar17 = uVar17 + 1;
    }
LAB_00135035:
    local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_618,(char)uVar17 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_618._M_dataplus._M_p + (XVar3 >> 0x1f),uVar17,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_7f8,&local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != &local_618.field_2) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_5e8 = (PFN_xrEnumerateViewConfigurationViews)0x0;
    p_Stack_5e0 = (PFN_xrEnumerateSwapchainFormats)0x0;
    local_5f8 = (PFN_xrEnumerateViewConfigurations)0x0;
    p_Stack_5f0 = (PFN_xrGetViewConfigurationProperties)0x0;
    local_618.field_2._M_allocated_capacity = 0;
    local_618.field_2._8_8_ = 0;
    local_618._M_dataplus._M_p = (pointer)0x0;
    local_618._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,value->type,(char *)&local_618);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_7f8,(char (*) [64])&local_618);
  }
  local_818 = local_808;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_818,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_818);
  value_00 = value->next;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_658,local_818,local_810 + (long)local_818);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_658,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_798,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_798);
  uVar16 = value->layerFlags;
  cVar18 = '\x01';
  if (9 < uVar16) {
    uVar15 = uVar16;
    cVar8 = '\x04';
    do {
      cVar18 = cVar8;
      if (uVar15 < 100) {
        cVar18 = cVar18 + -2;
        goto LAB_001351e3;
      }
      if (uVar15 < 1000) {
        cVar18 = cVar18 + -1;
        goto LAB_001351e3;
      }
      if (uVar15 < 10000) goto LAB_001351e3;
      bVar9 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar8 = cVar18 + '\x04';
    } while (bVar9);
    cVar18 = cVar18 + '\x01';
  }
LAB_001351e3:
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_618,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_618._M_dataplus._M_p,(uint)local_618._M_string_length,uVar16);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [24])"XrCompositionLayerFlags",&local_798,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_7b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_618);
  *(uint *)((long)&local_618.field_2 + *(long *)(local_618._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_618.field_2 + *(long *)(local_618._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&local_618);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&local_7b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
  pXVar1 = (XrCompositionLayerCylinderKHR *)(local_498 + 0x10);
  if ((XrCompositionLayerCylinderKHR *)local_498._0_8_ != pXVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_7d8);
  XVar4 = value->eyeVisibility;
  __val_00 = -XVar4;
  if (0 < (int)XVar4) {
    __val_00 = XVar4;
  }
  uVar17 = 1;
  if (9 < __val_00) {
    uVar16 = (ulong)__val_00;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar13 = (uint)uVar16;
      if (uVar13 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00135396;
      }
      if (uVar13 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00135396;
      }
      if (uVar13 < 10000) goto LAB_00135396;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar13);
    uVar17 = uVar17 + 1;
  }
LAB_00135396:
  local_498._0_8_ = pXVar1;
  std::__cxx11::string::_M_construct((ulong)local_498,(char)uVar17 - (char)((int)XVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_498._0_8_ + (ulong)(XVar4 >> 0x1f)),uVar17,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"XrEyeVisibility",&local_7d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
  if ((XrCompositionLayerCylinderKHR *)local_498._0_8_ != pXVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_758 = local_748;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_758,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_758);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_678,local_758,local_750 + (long)local_758);
  pXVar19 = (XrGeneratedDispatchTable *)local_698;
  local_698._0_8_ = local_698 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"XrSwapchainSubImage","");
  bVar9 = ApiDumpOutputXrStruct
                    (pXVar19,&value->subImage,&local_678,(string *)local_698,false,contents);
  if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_778 = local_768;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_778,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_778);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6b8,local_778,local_770 + (long)local_778);
  pXVar19 = (XrGeneratedDispatchTable *)local_6d8;
  local_6d8._0_8_ = local_6d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"XrPosef","");
  bVar9 = ApiDumpOutputXrStruct(pXVar19,&value->pose,&local_6b8,(string *)local_6d8,false,contents);
  if ((undefined1 *)local_6d8._0_8_ != local_6d8 + 0x10) {
    operator_delete((void *)local_6d8._0_8_,(ulong)(local_6c8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if (bVar9) {
    pcVar5 = (prefix->_M_dataplus)._M_p;
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6f8,pcVar5,pcVar5 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_6f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    *(undefined8 *)(local_498 + *(long *)(local_498._0_8_ + -0x18) + 8) = 0x20;
    std::ostream::_M_insert<double>((double)value->radius);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_6f8,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
    }
    pcVar5 = (prefix->_M_dataplus)._M_p;
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_718,pcVar5,pcVar5 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_718);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<double>((double)value->centralAngle);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_718,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,
                      (ulong)(local_320[0].field_2._M_allocated_capacity + 1));
    }
    pcVar5 = (prefix->_M_dataplus)._M_p;
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_738,pcVar5,pcVar5 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_738);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(undefined8 *)
     ((long)&local_320[0]._M_string_length + *(long *)(local_320[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<double>((double)value->aspectRatio);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_738,&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,
                      (ulong)(local_638.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    if (local_778 != local_768) {
      operator_delete(local_778,local_768[0] + 1);
    }
    if (local_758 != local_748) {
      operator_delete(local_758,local_748[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_618);
    std::ios_base::~ios_base(local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    if (local_818 != local_808) {
      operator_delete(local_818,local_808[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
  __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerCylinderKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string centralangle_prefix = prefix;
        centralangle_prefix += "centralAngle";
        std::ostringstream oss_centralAngle;
        oss_centralAngle << std::setprecision(32) << (value->centralAngle);
        contents.emplace_back("float", centralangle_prefix, oss_centralAngle.str());
        std::string aspectratio_prefix = prefix;
        aspectratio_prefix += "aspectRatio";
        std::ostringstream oss_aspectRatio;
        oss_aspectRatio << std::setprecision(32) << (value->aspectRatio);
        contents.emplace_back("float", aspectratio_prefix, oss_aspectRatio.str());
        return true;
    } catch(...) {
    }
    return false;
}